

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_setuid_setgid(void)

{
  __uid_t _Var1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  passwd *ppVar4;
  undefined8 uVar5;
  anon_union_8_2_13e1ed65_for_data aVar6;
  int *piVar7;
  ulong uVar8;
  uv_process_options_t *__ptr;
  ulong uVar9;
  uv_buf_t *buf;
  uv_process_options_t *unaff_RBX;
  undefined1 *nread;
  uv_stream_t *tcp;
  char *unaff_R12;
  uv_process_options_t *unaff_R14;
  char *unaff_R15;
  uv_process_options_t *__nmemb;
  undefined1 auVar10 [16];
  int64_t eval_b;
  int64_t eval_a;
  char gidstr [10];
  char uidstr [10];
  undefined1 auStack_950 [48];
  uv_handle_t *apuStack_920 [11];
  uv_loop_t *puStack_8c8;
  undefined8 auStack_760 [29];
  uv_stdio_container_t uStack_678;
  undefined4 uStack_668;
  undefined4 uStack_658;
  anon_union_8_2_13e1ed65_for_data aStack_640;
  long lStack_608;
  int iStack_600;
  int iStack_5fc;
  undefined1 auStack_5f8 [16];
  undefined8 uStack_5e8;
  undefined2 uStack_5e0;
  uv_stdio_container_t uStack_5d8;
  long alStack_5c8 [25];
  long alStack_500 [25];
  uv_exit_cb ap_Stack_438 [29];
  undefined1 auStack_350 [88];
  int iStack_2f8;
  anon_union_8_2_13e1ed65_for_data aStack_190;
  uv_process_options_t *puStack_188;
  long lStack_180;
  long lStack_178;
  anon_union_8_2_13e1ed65_for_data aStack_170;
  char cStack_159;
  long lStack_158;
  long lStack_150;
  anon_union_8_2_13e1ed65_for_data aStack_148;
  uv_process_options_t *puStack_140;
  uv_process_options_t *apuStack_138 [2];
  uv_process_options_t *puStack_128;
  cpu_set_t cStack_120;
  anon_union_8_2_13e1ed65_for_data aStack_98;
  char *pcStack_90;
  uv_process_options_t *puStack_88;
  code *pcStack_80;
  long lStack_78;
  long lStack_70;
  anon_union_8_2_13e1ed65_for_data aStack_68;
  long lStack_60;
  long lStack_58;
  anon_union_8_2_13e1ed65_for_data aStack_50;
  long local_48;
  long local_40;
  
  aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c20f9;
  _Var1 = getuid();
  if (_Var1 != 0) {
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c22b8;
    run_test_spawn_setuid_setgid_cold_1();
    return 7;
  }
  aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c2114;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c2120;
  ppVar4 = getpwnam("nobody");
  if (ppVar4 == (passwd *)0x0) {
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c22cb;
    run_test_spawn_setuid_setgid_cold_8();
LAB_001c22cb:
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c22d8;
    run_test_spawn_setuid_setgid_cold_2();
LAB_001c22d8:
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c22e5;
    run_test_spawn_setuid_setgid_cold_3();
LAB_001c22e5:
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c22f2;
    run_test_spawn_setuid_setgid_cold_4();
LAB_001c22f2:
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c22ff;
    run_test_spawn_setuid_setgid_cold_5();
  }
  else {
    options.uid = ppVar4->pw_uid;
    unaff_RBX = &options;
    options.gid = ppVar4->pw_gid;
    unaff_R15 = "%d";
    unaff_R12 = &stack0xffffffffffffffd6;
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c2168;
    snprintf(unaff_R12,10,"%d",(ulong)ppVar4->pw_uid);
    unaff_R14 = (uv_process_options_t *)&stack0xffffffffffffffcc;
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c2183;
    snprintf((char *)unaff_R14,10,"%d",(ulong)ppVar4->pw_gid);
    options.args[2] = unaff_R12;
    options.args[3] = (char *)unaff_R14;
    options.flags = 3;
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c21a8;
    uVar5 = uv_default_loop();
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c21ba;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 == -0xd) {
      aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c22bf;
      run_test_spawn_setuid_setgid_cold_7();
      return 7;
    }
    local_40 = (long)iVar2;
    local_48 = 0;
    if (local_40 != 0) goto LAB_001c22cb;
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c21e6;
    uVar5 = uv_default_loop();
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c21f0;
    iVar2 = uv_run(uVar5,0);
    local_40 = (long)iVar2;
    local_48 = 0;
    if (local_40 != 0) goto LAB_001c22d8;
    local_40 = 1;
    local_48 = (long)exit_cb_called;
    if (local_48 != 1) goto LAB_001c22e5;
    local_40 = 1;
    local_48 = (long)close_cb_called;
    if (local_48 != 1) goto LAB_001c22f2;
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c2259;
    unaff_R14 = (uv_process_options_t *)uv_default_loop();
    unaff_RBX = (uv_process_options_t *)0x0;
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c226f;
    uv_walk(unaff_R14,close_walk_cb,0);
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c2279;
    uv_run(unaff_R14,0);
    local_40 = 0;
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c2287;
    uVar5 = uv_default_loop();
    aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c228f;
    iVar2 = uv_loop_close(uVar5);
    local_48 = (long)iVar2;
    if (local_40 == local_48) {
      aStack_50 = (anon_union_8_2_13e1ed65_for_data)0x1c22a5;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_50.stream = (uv_stream_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_6();
  aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c2316;
  aStack_50 = (anon_union_8_2_13e1ed65_for_data)unaff_RBX;
  _Var1 = getuid();
  if (_Var1 == 0) {
    aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c2326;
    aVar6.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar6.stream == (uv_stream_t *)0x0) goto LAB_001c24b5;
    aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c233a;
    iVar2 = setgid(*(__gid_t *)&(aVar6.stream)->field_0x14);
    lStack_58 = (long)iVar2;
    lStack_60 = 0;
    unaff_RBX = (uv_process_options_t *)aVar6.stream;
    if (lStack_58 != 0) goto LAB_001c24ba;
    aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c2360;
    iVar2 = setuid((aVar6.stream)->type);
    lStack_58 = (long)iVar2;
    lStack_60 = 0;
    if (lStack_58 == 0) goto LAB_001c237e;
  }
  else {
LAB_001c237e:
    aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c2391;
    init_process_options("spawn_helper1",fail_cb);
    unaff_RBX = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c23ae;
    uVar5 = uv_default_loop();
    aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c23c0;
    iVar2 = uv_spawn(uVar5,&process,&options);
    lStack_58 = (long)iVar2;
    lStack_60 = -1;
    if (lStack_58 == -1) {
      aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c23e3;
      uVar5 = uv_default_loop();
      aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c23ed;
      iVar2 = uv_run(uVar5,0);
      lStack_58 = (long)iVar2;
      lStack_60 = 0;
      if (lStack_58 != 0) goto LAB_001c248e;
      lStack_58 = (long)close_cb_called;
      lStack_60 = 0;
      if (lStack_58 != 0) goto LAB_001c249b;
      aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c242f;
      unaff_RBX = (uv_process_options_t *)uv_default_loop();
      aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c2443;
      uv_walk(unaff_RBX,close_walk_cb,0);
      aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c244d;
      uv_run(unaff_RBX,0);
      lStack_58 = 0;
      aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c245b;
      uVar5 = uv_default_loop();
      aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c2463;
      iVar2 = uv_loop_close(uVar5);
      lStack_60 = (long)iVar2;
      if (lStack_58 == lStack_60) {
        aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c2479;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c248e;
      run_test_spawn_setuid_fails_cold_3();
LAB_001c248e:
      aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c249b;
      run_test_spawn_setuid_fails_cold_4();
LAB_001c249b:
      aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c24a8;
      run_test_spawn_setuid_fails_cold_5();
    }
    aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c24b5;
    run_test_spawn_setuid_fails_cold_6();
LAB_001c24b5:
    aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c24ba;
    run_test_spawn_setuid_fails_cold_7();
LAB_001c24ba:
    aStack_68 = (anon_union_8_2_13e1ed65_for_data)0x1c24c7;
    run_test_spawn_setuid_fails_cold_1();
  }
  aStack_68.stream = (uv_stream_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  pcStack_80 = (code *)0x1c24de;
  aStack_68 = (anon_union_8_2_13e1ed65_for_data)unaff_RBX;
  _Var1 = getuid();
  if (_Var1 == 0) {
    pcStack_80 = (code *)0x1c24ee;
    aVar6.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar6.stream == (uv_stream_t *)0x0) goto LAB_001c267d;
    pcStack_80 = (code *)0x1c2502;
    iVar2 = setgid(*(__gid_t *)&(aVar6.stream)->field_0x14);
    lStack_70 = (long)iVar2;
    lStack_78 = 0;
    unaff_RBX = (uv_process_options_t *)aVar6.stream;
    if (lStack_70 != 0) goto LAB_001c2682;
    pcStack_80 = (code *)0x1c2528;
    iVar2 = setuid((aVar6.stream)->type);
    lStack_70 = (long)iVar2;
    lStack_78 = 0;
    if (lStack_70 == 0) goto LAB_001c2546;
  }
  else {
LAB_001c2546:
    pcStack_80 = (code *)0x1c2559;
    init_process_options("spawn_helper1",fail_cb);
    unaff_RBX = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    pcStack_80 = (code *)0x1c2576;
    uVar5 = uv_default_loop();
    pcStack_80 = (code *)0x1c2588;
    iVar2 = uv_spawn(uVar5,&process,&options);
    lStack_70 = (long)iVar2;
    lStack_78 = -1;
    if (lStack_70 == -1) {
      pcStack_80 = (code *)0x1c25ab;
      uVar5 = uv_default_loop();
      pcStack_80 = (code *)0x1c25b5;
      iVar2 = uv_run(uVar5,0);
      lStack_70 = (long)iVar2;
      lStack_78 = 0;
      if (lStack_70 != 0) goto LAB_001c2656;
      lStack_70 = (long)close_cb_called;
      lStack_78 = 0;
      if (lStack_70 != 0) goto LAB_001c2663;
      pcStack_80 = (code *)0x1c25f7;
      unaff_RBX = (uv_process_options_t *)uv_default_loop();
      pcStack_80 = (code *)0x1c260b;
      uv_walk(unaff_RBX,close_walk_cb,0);
      pcStack_80 = (code *)0x1c2615;
      uv_run(unaff_RBX,0);
      lStack_70 = 0;
      pcStack_80 = (code *)0x1c2623;
      uVar5 = uv_default_loop();
      pcStack_80 = (code *)0x1c262b;
      iVar2 = uv_loop_close(uVar5);
      lStack_78 = (long)iVar2;
      if (lStack_70 == lStack_78) {
        pcStack_80 = (code *)0x1c2641;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      pcStack_80 = (code *)0x1c2656;
      run_test_spawn_setgid_fails_cold_3();
LAB_001c2656:
      pcStack_80 = (code *)0x1c2663;
      run_test_spawn_setgid_fails_cold_4();
LAB_001c2663:
      pcStack_80 = (code *)0x1c2670;
      run_test_spawn_setgid_fails_cold_5();
    }
    pcStack_80 = (code *)0x1c267d;
    run_test_spawn_setgid_fails_cold_6();
LAB_001c267d:
    pcStack_80 = (code *)0x1c2682;
    run_test_spawn_setgid_fails_cold_7();
LAB_001c2682:
    pcStack_80 = (code *)0x1c268f;
    run_test_spawn_setgid_fails_cold_1();
  }
  pcStack_80 = run_test_spawn_affinity;
  run_test_spawn_setgid_fails_cold_2();
  aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c26af;
  aStack_98 = (anon_union_8_2_13e1ed65_for_data)unaff_RBX;
  pcStack_90 = unaff_R12;
  puStack_88 = unaff_R14;
  pcStack_80 = (code *)unaff_R15;
  uVar3 = uv_cpumask_size();
  if ((int)uVar3 < 1) {
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c28a4;
    run_test_spawn_affinity_cold_1();
LAB_001c28a4:
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c28b1;
    run_test_spawn_affinity_cold_2();
LAB_001c28b1:
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c28be;
    run_test_spawn_affinity_cold_3();
LAB_001c28be:
    __ptr = unaff_RBX;
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c28c3;
    run_test_spawn_affinity_cold_9();
LAB_001c28c3:
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c28c8;
    run_test_spawn_affinity_cold_4();
LAB_001c28c8:
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c28cd;
    run_test_spawn_affinity_cold_5();
LAB_001c28cd:
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c28d2;
    run_test_spawn_affinity_cold_6();
LAB_001c28d2:
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c28d7;
    run_test_spawn_affinity_cold_7();
  }
  else {
    unaff_RBX._4_4_ = 0;
    unaff_RBX._0_4_ = uVar3;
    cStack_120.__bits[0xe] = 0;
    cStack_120.__bits[0xf] = 0;
    cStack_120.__bits[0xc] = 0;
    cStack_120.__bits[0xd] = 0;
    cStack_120.__bits[10] = 0;
    cStack_120.__bits[0xb] = 0;
    cStack_120.__bits[8] = 0;
    cStack_120.__bits[9] = 0;
    cStack_120.__bits[6] = 0;
    cStack_120.__bits[7] = 0;
    cStack_120.__bits[4] = 0;
    cStack_120.__bits[5] = 0;
    cStack_120.__bits[2] = 0;
    cStack_120.__bits[3] = 0;
    cStack_120.__bits[0] = 0;
    cStack_120.__bits[1] = 0;
    unaff_R14 = (uv_process_options_t *)0x0;
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c26ef;
    iVar2 = sched_getaffinity(0,0x80,&cStack_120);
    if (iVar2 != 0) {
      aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c26f8;
      piVar7 = __errno_location();
      unaff_R14 = (uv_process_options_t *)(long)*piVar7;
    }
    puStack_140 = (uv_process_options_t *)0x0;
    apuStack_138[0] = unaff_R14;
    if (unaff_R14 != (uv_process_options_t *)0x0) goto LAB_001c28a4;
    uVar9 = 1;
    if (1 < (int)uVar3) {
      uVar9 = (ulong)uVar3;
    }
    uVar8 = 0;
    do {
      if ((uVar8 < 0x400) && ((cStack_120.__bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0))
      goto LAB_001c2748;
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
    uVar8 = (ulong)uVar3;
LAB_001c2748:
    unaff_R14 = (uv_process_options_t *)(uVar8 & 0xffffffff);
    __nmemb = (uv_process_options_t *)(ulong)uVar3;
    puStack_140 = __nmemb;
    apuStack_138[0] = unaff_R14;
    if (__nmemb <= unaff_R14) goto LAB_001c28b1;
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c2784;
    snprintf((char *)apuStack_138,0xb,"%d",unaff_R14);
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c2797;
    init_process_options("spawn_helper_affinity",exit_cb);
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c27a4;
    __ptr = (uv_process_options_t *)calloc((size_t)__nmemb,1);
    if ((uv_stream_t *)__ptr == (uv_stream_t *)0x0) goto LAB_001c28be;
    *(char *)((long)&unaff_R14->exit_cb + (long)&((uv_stream_t *)__ptr)->data) = '\x01';
    unaff_R14 = &options;
    options.cpumask = (char *)__ptr;
    options.cpumask_size = (size_t)__nmemb;
    options.args[2] = (char *)apuStack_138;
    options.args[3] = "dummy";
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c27ec;
    uVar5 = uv_default_loop();
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c27fe;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_001c28c3;
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c280b;
    uVar5 = uv_default_loop();
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c2815;
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_001c28c8;
    if (exit_cb_called != 1) goto LAB_001c28cd;
    if (close_cb_called != 1) goto LAB_001c28d2;
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c283f;
    free(__ptr);
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c2844;
    __ptr = (uv_process_options_t *)uv_default_loop();
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c2858;
    uv_walk(__ptr,close_walk_cb,0);
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c2862;
    uv_run(__ptr,0);
    puStack_140 = (uv_process_options_t *)0x0;
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c286f;
    uVar5 = uv_default_loop();
    aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c2877;
    iVar2 = uv_loop_close(uVar5);
    puStack_128 = (uv_process_options_t *)(long)iVar2;
    if (puStack_140 == puStack_128) {
      aStack_148 = (anon_union_8_2_13e1ed65_for_data)0x1c288e;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_148.stream = (uv_stream_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c28ee;
  aStack_148 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  iVar2 = uv_cpumask_size();
  if (iVar2 < 1) {
    aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c29ad;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001c29ad:
    aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c29b2;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001c29b2:
    aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c29b7;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c2909;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_159;
    cStack_159 = '\0';
    options.cpumask_size = 0;
    __ptr = &options;
    aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c292f;
    uVar5 = uv_default_loop();
    aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c2941;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != -0x16) goto LAB_001c29ad;
    if (exit_cb_called != 0) goto LAB_001c29b2;
    aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c2954;
    __ptr = (uv_process_options_t *)uv_default_loop();
    aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c2968;
    uv_walk(__ptr,close_walk_cb,0);
    aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c2972;
    uv_run(__ptr,0);
    lStack_150 = 0;
    aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c2980;
    uVar5 = uv_default_loop();
    aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c2988;
    iVar2 = uv_loop_close(uVar5);
    lStack_158 = (long)iVar2;
    if (lStack_150 == lStack_158) {
      aStack_170 = (anon_union_8_2_13e1ed65_for_data)0x1c29a0;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_170.stream = (uv_stream_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_188 = (uv_process_options_t *)0x1c29d9;
  aStack_170 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_188 = (uv_process_options_t *)0x1c29de;
  uVar5 = uv_default_loop();
  puStack_188 = (uv_process_options_t *)0x1c29f4;
  iVar2 = uv_spawn(uVar5,&process,&options);
  lStack_178 = (long)iVar2;
  lStack_180 = 0;
  if (lStack_178 == 0) {
    puStack_188 = (uv_process_options_t *)0x1c2a17;
    uVar5 = uv_default_loop();
    puStack_188 = (uv_process_options_t *)0x1c2a21;
    iVar2 = uv_run(uVar5,0);
    lStack_178 = (long)iVar2;
    lStack_180 = 0;
    if (lStack_178 != 0) goto LAB_001c2b32;
    puStack_188 = (uv_process_options_t *)0x1c2a4b;
    iVar2 = uv_is_closing(&process);
    lStack_178 = (long)iVar2;
    lStack_180 = 0;
    if (lStack_178 != 0) goto LAB_001c2b3f;
    puStack_188 = (uv_process_options_t *)0x1c2a77;
    uv_close(&process,0);
    puStack_188 = (uv_process_options_t *)0x1c2a7c;
    uVar5 = uv_default_loop();
    puStack_188 = (uv_process_options_t *)0x1c2a86;
    iVar2 = uv_run(uVar5,0);
    lStack_178 = (long)iVar2;
    lStack_180 = 0;
    if (lStack_178 != 0) goto LAB_001c2b4c;
    lStack_178 = 1;
    puStack_188 = (uv_process_options_t *)0x1c2ab9;
    iVar2 = uv_is_closing(&process);
    lStack_180 = (long)iVar2;
    if (lStack_178 != lStack_180) goto LAB_001c2b59;
    puStack_188 = (uv_process_options_t *)0x1c2ad3;
    __ptr = (uv_process_options_t *)uv_default_loop();
    puStack_188 = (uv_process_options_t *)0x1c2ae7;
    uv_walk(__ptr,close_walk_cb,0);
    puStack_188 = (uv_process_options_t *)0x1c2af1;
    uv_run(__ptr,0);
    lStack_178 = 0;
    puStack_188 = (uv_process_options_t *)0x1c2aff;
    uVar5 = uv_default_loop();
    puStack_188 = (uv_process_options_t *)0x1c2b07;
    iVar2 = uv_loop_close(uVar5);
    lStack_180 = (long)iVar2;
    if (lStack_178 == lStack_180) {
      puStack_188 = (uv_process_options_t *)0x1c2b1d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_188 = (uv_process_options_t *)0x1c2b32;
    run_test_spawn_auto_unref_cold_1();
LAB_001c2b32:
    puStack_188 = (uv_process_options_t *)0x1c2b3f;
    run_test_spawn_auto_unref_cold_2();
LAB_001c2b3f:
    puStack_188 = (uv_process_options_t *)0x1c2b4c;
    run_test_spawn_auto_unref_cold_3();
LAB_001c2b4c:
    puStack_188 = (uv_process_options_t *)0x1c2b59;
    run_test_spawn_auto_unref_cold_4();
LAB_001c2b59:
    puStack_188 = (uv_process_options_t *)0x1c2b66;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_188 = (uv_process_options_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  uStack_5e8 = 0x6c756e2f7665642f;
  uStack_5e0 = 0x6c;
  aStack_190 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  puStack_188 = unaff_R14;
  iVar2 = uv_fs_open(0,auStack_350,&uStack_5e8,2,0,0);
  ap_Stack_438[0] = (uv_exit_cb)(long)iVar2;
  alStack_500[0] = 0;
  if (ap_Stack_438[0] == (uv_exit_cb)0x0) {
    iStack_600 = iStack_2f8;
    init_process_options("spawn_helper8",exit_cb);
    uVar5 = uv_default_loop();
    __ptr = (uv_process_options_t *)ap_Stack_438;
    iVar2 = uv_pipe_init(uVar5,__ptr,0);
    alStack_500[0] = (long)iVar2;
    alStack_5c8[0] = 0;
    if (alStack_500[0] != 0) goto LAB_001c2e8a;
    options.stdio = &uStack_5d8;
    uStack_5d8.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_5d8.data.stream = (uv_stream_t *)__ptr;
    iStack_5fc = dup(iStack_600);
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    alStack_500[0] = (long)iVar2;
    alStack_5c8[0] = 0;
    if (alStack_500[0] != 0) goto LAB_001c2e9c;
    auStack_5f8 = uv_buf_init(&iStack_600,4);
    iVar2 = uv_write(alStack_500,ap_Stack_438,auStack_5f8,1,write_null_cb);
    alStack_5c8[0] = (long)iVar2;
    if (alStack_5c8[0] != 0) goto LAB_001c2eae;
    auVar10 = uv_buf_init(&iStack_5fc,4);
    auStack_5f8 = auVar10;
    iVar2 = uv_write(alStack_5c8,ap_Stack_438,auStack_5f8,1,write_cb);
    lStack_608 = 0;
    if (iVar2 != 0) goto LAB_001c2ebd;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    lStack_608 = 0;
    if (iVar2 != 0) goto LAB_001c2ecc;
    iVar2 = uv_fs_close(0,auStack_350,iStack_600,0);
    lStack_608 = 0;
    if (iVar2 != 0) goto LAB_001c2edb;
    lStack_608 = (long)exit_cb_called;
    if (lStack_608 != 1) goto LAB_001c2eea;
    lStack_608 = (long)close_cb_called;
    if (lStack_608 != 2) goto LAB_001c2ef9;
    __ptr = (uv_process_options_t *)uv_default_loop();
    uv_walk(__ptr,close_walk_cb,0);
    uv_run(__ptr,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    lStack_608 = (long)iVar2;
    if (lStack_608 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001c2e8a:
    run_test_spawn_fs_open_cold_2();
LAB_001c2e9c:
    run_test_spawn_fs_open_cold_3();
LAB_001c2eae:
    run_test_spawn_fs_open_cold_4();
LAB_001c2ebd:
    run_test_spawn_fs_open_cold_5();
LAB_001c2ecc:
    run_test_spawn_fs_open_cold_6();
LAB_001c2edb:
    run_test_spawn_fs_open_cold_7();
LAB_001c2eea:
    run_test_spawn_fs_open_cold_8();
LAB_001c2ef9:
    run_test_spawn_fs_open_cold_9();
  }
  iVar2 = (int)&lStack_608;
  run_test_spawn_fs_open_cold_10();
  if (iVar2 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  aStack_640 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  auStack_950._24_16_ = uv_buf_init("",1);
  iVar2 = uv_pipe(auStack_950 + 0x10,0,0);
  if (iVar2 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_678;
    uStack_678.flags = UV_INHERIT_FD;
    uStack_678.data.file = auStack_950._16_4_;
    uStack_668 = 0;
    uStack_658 = 0;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    apuStack_920[0] = (uv_handle_t *)(long)iVar2;
    auStack_760[0] = 0;
    if (apuStack_920[0] != (uv_handle_t *)0x0) goto LAB_001c33c5;
    uv_unref(&process);
    uVar5 = uv_default_loop();
    iVar2 = uv_pipe_init(uVar5,auStack_760,0);
    apuStack_920[0] = (uv_handle_t *)(long)iVar2;
    auStack_950._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_920[0] != (uv_handle_t *)0x0) goto LAB_001c33d7;
    iVar2 = uv_pipe_open(auStack_760,auStack_950._16_4_);
    apuStack_920[0] = (uv_handle_t *)(long)iVar2;
    auStack_950._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_920[0] != (uv_handle_t *)0x0) goto LAB_001c33e6;
    auStack_950._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar2 = uv_read_start(auStack_760,on_alloc,on_read_once);
    apuStack_920[0] = (uv_handle_t *)(long)iVar2;
    auStack_950._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_920[0] != (uv_handle_t *)0x0) goto LAB_001c33f5;
    auStack_950._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write(0,apuStack_920,auStack_950._20_4_,auStack_950 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_950._8_8_ = SEXT48(iVar2);
    if (auStack_950._0_8_ != auStack_950._8_8_) goto LAB_001c3404;
    auStack_950._0_8_ = (uv_loop_t *)0x1;
    auStack_950._8_8_ = puStack_8c8;
    if (puStack_8c8 != (uv_loop_t *)0x1) goto LAB_001c3413;
    uv_fs_req_cleanup(apuStack_920);
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,1);
    auStack_950._0_8_ = SEXT48(iVar2);
    auStack_950._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_950._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3422;
    auStack_950._0_8_ = (uv_loop_t *)0x1;
    auStack_950._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_950._8_8_ != (uv_loop_t *)0x1) goto LAB_001c3431;
    uv_close(auStack_760,close_cb);
    auStack_950._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write(0,apuStack_920,auStack_950._20_4_,auStack_950 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_950._8_8_ = SEXT48(iVar2);
    if (auStack_950._0_8_ != auStack_950._8_8_) goto LAB_001c3440;
    auStack_950._0_8_ = (uv_loop_t *)0x1;
    auStack_950._8_8_ = puStack_8c8;
    if (puStack_8c8 != (uv_loop_t *)0x1) goto LAB_001c344f;
    uv_fs_req_cleanup(apuStack_920);
    uVar5 = uv_default_loop();
    iVar2 = uv_timer_init(uVar5,&timer);
    auStack_950._0_8_ = SEXT48(iVar2);
    auStack_950._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_950._0_8_ != (uv_loop_t *)0x0) goto LAB_001c345e;
    iVar2 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_950._0_8_ = SEXT48(iVar2);
    auStack_950._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_950._0_8_ != (uv_loop_t *)0x0) goto LAB_001c346d;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,1);
    if (iVar2 == 1) {
      uVar5 = uv_default_loop();
      iVar2 = uv_run(uVar5,1);
      auStack_950._0_8_ = SEXT48(iVar2);
      auStack_950._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_950._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34b8;
    }
    auStack_950._0_8_ = (uv_loop_t *)0x1;
    auStack_950._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_950._8_8_ != (uv_loop_t *)0x1) goto LAB_001c347c;
    iVar2 = uv_process_kill(&process,0xf);
    auStack_950._0_8_ = SEXT48(iVar2);
    auStack_950._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_950._0_8_ != (uv_loop_t *)0x0) goto LAB_001c348b;
    iVar2 = close(auStack_950._20_4_);
    auStack_950._0_8_ = SEXT48(iVar2);
    auStack_950._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_950._0_8_ != (uv_loop_t *)0x0) goto LAB_001c349a;
    auStack_950._20_4_ = -1;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    auStack_950._0_8_ = (uv_loop_t *)0x0;
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    auStack_950._8_8_ = SEXT48(iVar2);
    if (auStack_950._0_8_ == auStack_950._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001c33c5:
    run_test_closed_fd_events_cold_2();
LAB_001c33d7:
    run_test_closed_fd_events_cold_3();
LAB_001c33e6:
    run_test_closed_fd_events_cold_4();
LAB_001c33f5:
    run_test_closed_fd_events_cold_5();
LAB_001c3404:
    run_test_closed_fd_events_cold_6();
LAB_001c3413:
    run_test_closed_fd_events_cold_7();
LAB_001c3422:
    run_test_closed_fd_events_cold_8();
LAB_001c3431:
    run_test_closed_fd_events_cold_9();
LAB_001c3440:
    run_test_closed_fd_events_cold_10();
LAB_001c344f:
    run_test_closed_fd_events_cold_11();
LAB_001c345e:
    run_test_closed_fd_events_cold_12();
LAB_001c346d:
    run_test_closed_fd_events_cold_13();
LAB_001c347c:
    run_test_closed_fd_events_cold_15();
LAB_001c348b:
    run_test_closed_fd_events_cold_16();
LAB_001c349a:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001c34b8:
  tcp = (uv_stream_t *)auStack_950;
  nread = auStack_950 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop();
  on_read(tcp,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_setuid_setgid) {
  int r;
  struct passwd* pw;
  char uidstr[10];
  char gidstr[10];

  /* if not root, then this will fail. */
  uv_uid_t uid = getuid();
  if (uid != 0) {
    RETURN_SKIP("It should be run as root user");
  }

  init_process_options("spawn_helper_setuid_setgid", exit_cb);

  /* become the "nobody" user. */
  pw = getpwnam("nobody");
  ASSERT_NOT_NULL(pw);
  options.uid = pw->pw_uid;
  options.gid = pw->pw_gid;
  snprintf(uidstr, sizeof(uidstr), "%d", pw->pw_uid);
  snprintf(gidstr, sizeof(gidstr), "%d", pw->pw_gid);
  options.args[2] = uidstr;
  options.args[3] = gidstr;
  options.flags = UV_PROCESS_SETUID | UV_PROCESS_SETGID;

  r = uv_spawn(uv_default_loop(), &process, &options);
  if (r == UV_EACCES)
    RETURN_SKIP("user 'nobody' cannot access the test runner");

  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}